

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O3

void prf_vertex_list_set_list(prf_node_t *node,int count,uint32_t *ptr)

{
  if (node->opcode == prf_vertex_list_info.opcode) {
    node->length = (short)count * 4 + 4;
    memcpy(node->data,ptr,(long)(count << 2));
    return;
  }
  prf_error(9,"tried vertex_list_set_list() on node of type %d.",(ulong)node->opcode);
  return;
}

Assistant:

void
prf_vertex_list_set_list(
    prf_node_t * node,
    int count,
    uint32_t * ptr )
{
    assert( node != NULL && ptr != NULL );
    assert( count > 2 && count <= ((node->length - 4) / 4) );

    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex_list_set_list() on node of type %d.",
            node->opcode );
        return;
    }

    node->length = (count * 4) + 4;
    memcpy( node->data, ptr, count * 4 );
}